

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint __thiscall llvm::dwarf::getAttributeEncoding(dwarf *this,StringRef EncodingString)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char *pcVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  pcVar7 = EncodingString.Data;
  uVar4 = 0;
  uVar2 = 0;
  if ((pcVar7 == (char *)0xe) &&
     (uVar3 = (uint)(*(long *)(this + 6) == 0x737365726464615f &&
                    *(long *)this == 0x615f4554415f5744), uVar4 = uVar3, uVar2 = uVar3,
     *(long *)(this + 6) != 0x737365726464615f || *(long *)this != 0x615f4554415f5744)) {
    if (*(long *)(this + 6) == 0x6e61656c6f6f625f && *(long *)this == 0x625f4554415f5744) {
      uVar4 = 2;
    }
    uVar2 = 1;
    if (*(long *)(this + 6) != 0x6e61656c6f6f625f || *(long *)this != 0x625f4554415f5744) {
      uVar2 = uVar3;
    }
  }
  cVar6 = (char)uVar2;
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0x14) && (cVar6 == '\0')) {
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar18[0] = -((char)uVar1 == 'l');
    auVar18[1] = -((char)((uint)uVar1 >> 8) == 'o');
    auVar18[2] = -((char)((uint)uVar1 >> 0x10) == 'a');
    auVar18[3] = -((char)((uint)uVar1 >> 0x18) == 't');
    auVar18[4] = 0xff;
    auVar18[5] = 0xff;
    auVar18[6] = 0xff;
    auVar18[7] = 0xff;
    auVar18[8] = 0xff;
    auVar18[9] = 0xff;
    auVar18[10] = 0xff;
    auVar18[0xb] = 0xff;
    auVar18[0xc] = 0xff;
    auVar18[0xd] = 0xff;
    auVar18[0xe] = 0xff;
    auVar18[0xf] = 0xff;
    auVar9[0] = -(*this == (dwarf)'D');
    auVar9[1] = -(this[1] == (dwarf)'W');
    auVar9[2] = -(this[2] == (dwarf)'_');
    auVar9[3] = -(this[3] == (dwarf)'A');
    auVar9[4] = -(this[4] == (dwarf)'T');
    auVar9[5] = -(this[5] == (dwarf)'E');
    auVar9[6] = -(this[6] == (dwarf)'_');
    auVar9[7] = -(this[7] == (dwarf)'c');
    auVar9[8] = -(this[8] == (dwarf)'o');
    auVar9[9] = -(this[9] == (dwarf)'m');
    auVar9[10] = -(this[10] == (dwarf)'p');
    auVar9[0xb] = -(this[0xb] == (dwarf)'l');
    auVar9[0xc] = -(this[0xc] == (dwarf)'e');
    auVar9[0xd] = -(this[0xd] == (dwarf)'x');
    auVar9[0xe] = -(this[0xe] == (dwarf)'_');
    auVar9[0xf] = -(this[0xf] == (dwarf)'f');
    auVar9 = auVar9 & auVar18;
    bVar8 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 3;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0xc) && (cVar5 == '\0')) {
    if (*(int *)(this + 8) == 0x74616f6c && *(long *)this == 0x665f4554415f5744) {
      uVar4 = 4;
    }
    cVar6 = '\x01';
    if (*(int *)(this + 8) != 0x74616f6c || *(long *)this != 0x665f4554415f5744) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0xd) && (cVar6 == '\0')) {
    if (*(long *)(this + 5) == 0x64656e6769735f45 && *(long *)this == 0x735f4554415f5744) {
      uVar4 = 5;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 5) != 0x64656e6769735f45 || *(long *)this != 0x735f4554415f5744) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0x12) && (cVar5 == '\0')) {
    auVar10[0] = -(*this == (dwarf)'D');
    auVar10[1] = -(this[1] == (dwarf)'W');
    auVar10[2] = -(this[2] == (dwarf)'_');
    auVar10[3] = -(this[3] == (dwarf)'A');
    auVar10[4] = -(this[4] == (dwarf)'T');
    auVar10[5] = -(this[5] == (dwarf)'E');
    auVar10[6] = -(this[6] == (dwarf)'_');
    auVar10[7] = -(this[7] == (dwarf)'s');
    auVar10[8] = -(this[8] == (dwarf)'i');
    auVar10[9] = -(this[9] == (dwarf)'g');
    auVar10[10] = -(this[10] == (dwarf)'n');
    auVar10[0xb] = -(this[0xb] == (dwarf)'e');
    auVar10[0xc] = -(this[0xc] == (dwarf)'d');
    auVar10[0xd] = -(this[0xd] == (dwarf)'_');
    auVar10[0xe] = -(this[0xe] == (dwarf)'c');
    auVar10[0xf] = -(this[0xf] == (dwarf)'h');
    auVar19[0] = -((char)*(undefined2 *)(this + 0x10) == 'a');
    auVar19[1] = -((char)((ushort)*(undefined2 *)(this + 0x10) >> 8) == 'r');
    auVar19[2] = 0xff;
    auVar19[3] = 0xff;
    auVar19[4] = 0xff;
    auVar19[5] = 0xff;
    auVar19[6] = 0xff;
    auVar19[7] = 0xff;
    auVar19[8] = 0xff;
    auVar19[9] = 0xff;
    auVar19[10] = 0xff;
    auVar19[0xb] = 0xff;
    auVar19[0xc] = 0xff;
    auVar19[0xd] = 0xff;
    auVar19[0xe] = 0xff;
    auVar19[0xf] = 0xff;
    auVar19 = auVar19 & auVar10;
    bVar8 = (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 6;
    }
    cVar6 = '\x01';
    if (!bVar8) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0xf) && (cVar6 == '\0')) {
    if (*(long *)(this + 7) == 0x64656e6769736e75 && *(long *)this == 0x755f4554415f5744) {
      uVar4 = 7;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 7) != 0x64656e6769736e75 || *(long *)this != 0x755f4554415f5744) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0x14) && (cVar5 == '\0')) {
    auVar20[0] = -(*this == (dwarf)0x44);
    auVar20[1] = -(this[1] == (dwarf)0x57);
    auVar20[2] = -(this[2] == (dwarf)0x5f);
    auVar20[3] = -(this[3] == (dwarf)0x41);
    auVar20[4] = -(this[4] == (dwarf)0x54);
    auVar20[5] = -(this[5] == (dwarf)0x45);
    auVar20[6] = -(this[6] == (dwarf)0x5f);
    auVar20[7] = -(this[7] == (dwarf)0x75);
    auVar20[8] = -(this[8] == (dwarf)0x6e);
    auVar20[9] = -(this[9] == (dwarf)0x73);
    auVar20[10] = -(this[10] == (dwarf)0x69);
    auVar20[0xb] = -(this[0xb] == (dwarf)0x67);
    auVar20[0xc] = -(this[0xc] == (dwarf)0x6e);
    auVar20[0xd] = -(this[0xd] == (dwarf)0x65);
    auVar20[0xe] = -(this[0xe] == (dwarf)0x64);
    auVar20[0xf] = -(this[0xf] == (dwarf)0x5f);
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar11[0] = -((char)uVar1 == 'c');
    auVar11[1] = -((char)((uint)uVar1 >> 8) == 'h');
    auVar11[2] = -((char)((uint)uVar1 >> 0x10) == 'a');
    auVar11[3] = -((char)((uint)uVar1 >> 0x18) == 'r');
    auVar11[4] = 0xff;
    auVar11[5] = 0xff;
    auVar11[6] = 0xff;
    auVar11[7] = 0xff;
    auVar11[8] = 0xff;
    auVar11[9] = 0xff;
    auVar11[10] = 0xff;
    auVar11[0xb] = 0xff;
    auVar11[0xc] = 0xff;
    auVar11[0xd] = 0xff;
    auVar11[0xe] = 0xff;
    auVar11[0xf] = 0xff;
    auVar11 = auVar11 & auVar20;
    bVar8 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 8;
    }
    cVar6 = '\x01';
    if (!bVar8) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0x16) && (cVar6 == '\0')) {
    auVar21[0] = -(this[6] == (dwarf)'_');
    auVar21[1] = -(this[7] == (dwarf)'i');
    auVar21[2] = -(this[8] == (dwarf)'m');
    auVar21[3] = -(this[9] == (dwarf)'a');
    auVar21[4] = -(this[10] == (dwarf)'g');
    auVar21[5] = -(this[0xb] == (dwarf)'i');
    auVar21[6] = -(this[0xc] == (dwarf)'n');
    auVar21[7] = -(this[0xd] == (dwarf)'a');
    auVar21[8] = -(this[0xe] == (dwarf)'r');
    auVar21[9] = -(this[0xf] == (dwarf)'y');
    auVar21[10] = -(this[0x10] == (dwarf)'_');
    auVar21[0xb] = -(this[0x11] == (dwarf)'f');
    auVar21[0xc] = -(this[0x12] == (dwarf)'l');
    auVar21[0xd] = -(this[0x13] == (dwarf)'o');
    auVar21[0xe] = -(this[0x14] == (dwarf)'a');
    auVar21[0xf] = -(this[0x15] == (dwarf)'t');
    auVar12[0] = -(*this == (dwarf)'D');
    auVar12[1] = -(this[1] == (dwarf)'W');
    auVar12[2] = -(this[2] == (dwarf)'_');
    auVar12[3] = -(this[3] == (dwarf)'A');
    auVar12[4] = -(this[4] == (dwarf)'T');
    auVar12[5] = -(this[5] == (dwarf)'E');
    auVar12[6] = -(this[6] == (dwarf)'_');
    auVar12[7] = -(this[7] == (dwarf)'i');
    auVar12[8] = -(this[8] == (dwarf)'m');
    auVar12[9] = -(this[9] == (dwarf)'a');
    auVar12[10] = -(this[10] == (dwarf)'g');
    auVar12[0xb] = -(this[0xb] == (dwarf)'i');
    auVar12[0xc] = -(this[0xc] == (dwarf)'n');
    auVar12[0xd] = -(this[0xd] == (dwarf)'a');
    auVar12[0xe] = -(this[0xe] == (dwarf)'r');
    auVar12[0xf] = -(this[0xf] == (dwarf)'y');
    auVar12 = auVar12 & auVar21;
    bVar8 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 9;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0x15) && (cVar5 == '\0')) {
    auVar22[0] = -(this[5] == (dwarf)'E');
    auVar22[1] = -(this[6] == (dwarf)'_');
    auVar22[2] = -(this[7] == (dwarf)'p');
    auVar22[3] = -(this[8] == (dwarf)'a');
    auVar22[4] = -(this[9] == (dwarf)'c');
    auVar22[5] = -(this[10] == (dwarf)'k');
    auVar22[6] = -(this[0xb] == (dwarf)'e');
    auVar22[7] = -(this[0xc] == (dwarf)'d');
    auVar22[8] = -(this[0xd] == (dwarf)'_');
    auVar22[9] = -(this[0xe] == (dwarf)'d');
    auVar22[10] = -(this[0xf] == (dwarf)'e');
    auVar22[0xb] = -(this[0x10] == (dwarf)'c');
    auVar22[0xc] = -(this[0x11] == (dwarf)'i');
    auVar22[0xd] = -(this[0x12] == (dwarf)'m');
    auVar22[0xe] = -(this[0x13] == (dwarf)'a');
    auVar22[0xf] = -(this[0x14] == (dwarf)'l');
    auVar13[0] = -(*this == (dwarf)'D');
    auVar13[1] = -(this[1] == (dwarf)'W');
    auVar13[2] = -(this[2] == (dwarf)'_');
    auVar13[3] = -(this[3] == (dwarf)'A');
    auVar13[4] = -(this[4] == (dwarf)'T');
    auVar13[5] = -(this[5] == (dwarf)'E');
    auVar13[6] = -(this[6] == (dwarf)'_');
    auVar13[7] = -(this[7] == (dwarf)'p');
    auVar13[8] = -(this[8] == (dwarf)'a');
    auVar13[9] = -(this[9] == (dwarf)'c');
    auVar13[10] = -(this[10] == (dwarf)'k');
    auVar13[0xb] = -(this[0xb] == (dwarf)'e');
    auVar13[0xc] = -(this[0xc] == (dwarf)'d');
    auVar13[0xd] = -(this[0xd] == (dwarf)'_');
    auVar13[0xe] = -(this[0xe] == (dwarf)'d');
    auVar13[0xf] = -(this[0xf] == (dwarf)'e');
    auVar13 = auVar13 & auVar22;
    bVar8 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 10;
    }
    cVar6 = '\x01';
    if (!bVar8) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0x15) && (cVar6 == '\0')) {
    auVar23[0] = -(this[5] == (dwarf)'E');
    auVar23[1] = -(this[6] == (dwarf)'_');
    auVar23[2] = -(this[7] == (dwarf)'n');
    auVar23[3] = -(this[8] == (dwarf)'u');
    auVar23[4] = -(this[9] == (dwarf)'m');
    auVar23[5] = -(this[10] == (dwarf)'e');
    auVar23[6] = -(this[0xb] == (dwarf)'r');
    auVar23[7] = -(this[0xc] == (dwarf)'i');
    auVar23[8] = -(this[0xd] == (dwarf)'c');
    auVar23[9] = -(this[0xe] == (dwarf)'_');
    auVar23[10] = -(this[0xf] == (dwarf)'s');
    auVar23[0xb] = -(this[0x10] == (dwarf)'t');
    auVar23[0xc] = -(this[0x11] == (dwarf)'r');
    auVar23[0xd] = -(this[0x12] == (dwarf)'i');
    auVar23[0xe] = -(this[0x13] == (dwarf)'n');
    auVar23[0xf] = -(this[0x14] == (dwarf)'g');
    auVar14[0] = -(*this == (dwarf)'D');
    auVar14[1] = -(this[1] == (dwarf)'W');
    auVar14[2] = -(this[2] == (dwarf)'_');
    auVar14[3] = -(this[3] == (dwarf)'A');
    auVar14[4] = -(this[4] == (dwarf)'T');
    auVar14[5] = -(this[5] == (dwarf)'E');
    auVar14[6] = -(this[6] == (dwarf)'_');
    auVar14[7] = -(this[7] == (dwarf)'n');
    auVar14[8] = -(this[8] == (dwarf)'u');
    auVar14[9] = -(this[9] == (dwarf)'m');
    auVar14[10] = -(this[10] == (dwarf)'e');
    auVar14[0xb] = -(this[0xb] == (dwarf)'r');
    auVar14[0xc] = -(this[0xc] == (dwarf)'i');
    auVar14[0xd] = -(this[0xd] == (dwarf)'c');
    auVar14[0xe] = -(this[0xe] == (dwarf)'_');
    auVar14[0xf] = -(this[0xf] == (dwarf)'s');
    auVar14 = auVar14 & auVar23;
    bVar8 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 0xb;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0xd) && (cVar5 == '\0')) {
    if (*(long *)(this + 5) == 0x6465746964655f45 && *(long *)this == 0x655f4554415f5744) {
      uVar4 = 0xc;
    }
    cVar6 = '\x01';
    if (*(long *)(this + 5) != 0x6465746964655f45 || *(long *)this != 0x655f4554415f5744) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0x13) && (cVar6 == '\0')) {
    auVar24[0] = -(this[3] == (dwarf)'A');
    auVar24[1] = -(this[4] == (dwarf)'T');
    auVar24[2] = -(this[5] == (dwarf)'E');
    auVar24[3] = -(this[6] == (dwarf)'_');
    auVar24[4] = -(this[7] == (dwarf)'s');
    auVar24[5] = -(this[8] == (dwarf)'i');
    auVar24[6] = -(this[9] == (dwarf)'g');
    auVar24[7] = -(this[10] == (dwarf)'n');
    auVar24[8] = -(this[0xb] == (dwarf)'e');
    auVar24[9] = -(this[0xc] == (dwarf)'d');
    auVar24[10] = -(this[0xd] == (dwarf)'_');
    auVar24[0xb] = -(this[0xe] == (dwarf)'f');
    auVar24[0xc] = -(this[0xf] == (dwarf)'i');
    auVar24[0xd] = -(this[0x10] == (dwarf)'x');
    auVar24[0xe] = -(this[0x11] == (dwarf)'e');
    auVar24[0xf] = -(this[0x12] == (dwarf)'d');
    auVar15[0] = -(*this == (dwarf)'D');
    auVar15[1] = -(this[1] == (dwarf)'W');
    auVar15[2] = -(this[2] == (dwarf)'_');
    auVar15[3] = -(this[3] == (dwarf)'A');
    auVar15[4] = -(this[4] == (dwarf)'T');
    auVar15[5] = -(this[5] == (dwarf)'E');
    auVar15[6] = -(this[6] == (dwarf)'_');
    auVar15[7] = -(this[7] == (dwarf)'s');
    auVar15[8] = -(this[8] == (dwarf)'i');
    auVar15[9] = -(this[9] == (dwarf)'g');
    auVar15[10] = -(this[10] == (dwarf)'n');
    auVar15[0xb] = -(this[0xb] == (dwarf)'e');
    auVar15[0xc] = -(this[0xc] == (dwarf)'d');
    auVar15[0xd] = -(this[0xd] == (dwarf)'_');
    auVar15[0xe] = -(this[0xe] == (dwarf)'f');
    auVar15[0xf] = -(this[0xf] == (dwarf)'i');
    auVar15 = auVar15 & auVar24;
    bVar8 = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 0xd;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0x15) && (cVar5 == '\0')) {
    auVar25[0] = -(*this == (dwarf)0x44);
    auVar25[1] = -(this[1] == (dwarf)0x57);
    auVar25[2] = -(this[2] == (dwarf)0x5f);
    auVar25[3] = -(this[3] == (dwarf)0x41);
    auVar25[4] = -(this[4] == (dwarf)0x54);
    auVar25[5] = -(this[5] == (dwarf)0x45);
    auVar25[6] = -(this[6] == (dwarf)0x5f);
    auVar25[7] = -(this[7] == (dwarf)0x75);
    auVar25[8] = -(this[8] == (dwarf)0x6e);
    auVar25[9] = -(this[9] == (dwarf)0x73);
    auVar25[10] = -(this[10] == (dwarf)0x69);
    auVar25[0xb] = -(this[0xb] == (dwarf)0x67);
    auVar25[0xc] = -(this[0xc] == (dwarf)0x6e);
    auVar25[0xd] = -(this[0xd] == (dwarf)0x65);
    auVar25[0xe] = -(this[0xe] == (dwarf)0x64);
    auVar25[0xf] = -(this[0xf] == (dwarf)0x5f);
    auVar16[0] = -(this[5] == (dwarf)'E');
    auVar16[1] = -(this[6] == (dwarf)'_');
    auVar16[2] = -(this[7] == (dwarf)'u');
    auVar16[3] = -(this[8] == (dwarf)'n');
    auVar16[4] = -(this[9] == (dwarf)'s');
    auVar16[5] = -(this[10] == (dwarf)'i');
    auVar16[6] = -(this[0xb] == (dwarf)'g');
    auVar16[7] = -(this[0xc] == (dwarf)'n');
    auVar16[8] = -(this[0xd] == (dwarf)'e');
    auVar16[9] = -(this[0xe] == (dwarf)'d');
    auVar16[10] = -(this[0xf] == (dwarf)'_');
    auVar16[0xb] = -(this[0x10] == (dwarf)'f');
    auVar16[0xc] = -(this[0x11] == (dwarf)'i');
    auVar16[0xd] = -(this[0x12] == (dwarf)'x');
    auVar16[0xe] = -(this[0x13] == (dwarf)'e');
    auVar16[0xf] = -(this[0x14] == (dwarf)'d');
    auVar16 = auVar16 & auVar25;
    bVar8 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 0xe;
    }
    cVar6 = '\x01';
    if (!bVar8) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0x14) && (cVar6 == '\0')) {
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar26[0] = -((char)uVar1 == 'l');
    auVar26[1] = -((char)((uint)uVar1 >> 8) == 'o');
    auVar26[2] = -((char)((uint)uVar1 >> 0x10) == 'a');
    auVar26[3] = -((char)((uint)uVar1 >> 0x18) == 't');
    auVar26[4] = 0xff;
    auVar26[5] = 0xff;
    auVar26[6] = 0xff;
    auVar26[7] = 0xff;
    auVar26[8] = 0xff;
    auVar26[9] = 0xff;
    auVar26[10] = 0xff;
    auVar26[0xb] = 0xff;
    auVar26[0xc] = 0xff;
    auVar26[0xd] = 0xff;
    auVar26[0xe] = 0xff;
    auVar26[0xf] = 0xff;
    auVar17[0] = -(*this == (dwarf)'D');
    auVar17[1] = -(this[1] == (dwarf)'W');
    auVar17[2] = -(this[2] == (dwarf)'_');
    auVar17[3] = -(this[3] == (dwarf)'A');
    auVar17[4] = -(this[4] == (dwarf)'T');
    auVar17[5] = -(this[5] == (dwarf)'E');
    auVar17[6] = -(this[6] == (dwarf)'_');
    auVar17[7] = -(this[7] == (dwarf)'d');
    auVar17[8] = -(this[8] == (dwarf)'e');
    auVar17[9] = -(this[9] == (dwarf)'c');
    auVar17[10] = -(this[10] == (dwarf)'i');
    auVar17[0xb] = -(this[0xb] == (dwarf)'m');
    auVar17[0xc] = -(this[0xc] == (dwarf)'a');
    auVar17[0xd] = -(this[0xd] == (dwarf)'l');
    auVar17[0xe] = -(this[0xe] == (dwarf)'_');
    auVar17[0xf] = -(this[0xf] == (dwarf)'f');
    auVar17 = auVar17 & auVar26;
    bVar8 = (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar4 = 0xf;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0xa) && (cVar5 == '\0')) {
    if (*(short *)(this + 8) == 0x4654 && *(long *)this == 0x555f4554415f5744) {
      uVar4 = 0x10;
    }
    cVar6 = '\x01';
    if (*(short *)(this + 8) != 0x4654 || *(long *)this != 0x555f4554415f5744) {
      cVar6 = cVar5;
    }
  }
  cVar5 = cVar6;
  if ((pcVar7 == (char *)0xa) && (cVar6 == '\0')) {
    if (*(short *)(this + 8) == 0x5343 && *(long *)this == 0x555f4554415f5744) {
      uVar4 = 0x11;
    }
    cVar5 = '\x01';
    if (*(short *)(this + 8) != 0x5343 || *(long *)this != 0x555f4554415f5744) {
      cVar5 = cVar6;
    }
  }
  cVar6 = cVar5;
  if ((pcVar7 == (char *)0xc) && (cVar5 == '\0')) {
    if (*(int *)(this + 8) == 0x49494353 && *(long *)this == 0x415f4554415f5744) {
      uVar4 = 0x12;
    }
    cVar6 = '\x01';
    if (*(int *)(this + 8) != 0x49494353 || *(long *)this != 0x415f4554415f5744) {
      cVar6 = cVar5;
    }
  }
  uVar2 = 0;
  if (cVar6 != '\0') {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

unsigned llvm::dwarf::getAttributeEncoding(StringRef EncodingString) {
  return StringSwitch<unsigned>(EncodingString)
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  .Case("DW_ATE_" #NAME, DW_ATE_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}